

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMatrixAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>_>::writeValueTo
          (TypedAttribute<Imath_3_2::Matrix44<double>_> *this,OStream *os,int version)

{
  OStream *in_RSI;
  long in_RDI;
  double in_stack_ffffffffffffff68;
  OStream *v;
  OStream *in_stack_ffffffffffffff70;
  
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),0);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  v = in_RSI;
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),0);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_stack_ffffffffffffff70,(double)v);
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),0);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RSI,(double)v);
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),0);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RSI,(double)v);
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),1);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RSI,(double)v);
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),1);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RSI,(double)v);
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),1);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RSI,(double)v);
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),1);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RSI,(double)v);
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),2);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RSI,(double)v);
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),2);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RSI,(double)v);
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),2);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RSI,(double)v);
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),2);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RSI,(double)v);
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),3);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RSI,(double)v);
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),3);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RSI,(double)v);
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),3);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RSI,(double)v);
  Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)(in_RDI + 8),3);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RSI,(double)v);
  return;
}

Assistant:

IMF_EXPORT void
M44dAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value[0][0]);
    Xdr::write<StreamIO> (os, _value[0][1]);
    Xdr::write<StreamIO> (os, _value[0][2]);
    Xdr::write<StreamIO> (os, _value[0][3]);

    Xdr::write<StreamIO> (os, _value[1][0]);
    Xdr::write<StreamIO> (os, _value[1][1]);
    Xdr::write<StreamIO> (os, _value[1][2]);
    Xdr::write<StreamIO> (os, _value[1][3]);

    Xdr::write<StreamIO> (os, _value[2][0]);
    Xdr::write<StreamIO> (os, _value[2][1]);
    Xdr::write<StreamIO> (os, _value[2][2]);
    Xdr::write<StreamIO> (os, _value[2][3]);

    Xdr::write<StreamIO> (os, _value[3][0]);
    Xdr::write<StreamIO> (os, _value[3][1]);
    Xdr::write<StreamIO> (os, _value[3][2]);
    Xdr::write<StreamIO> (os, _value[3][3]);
}